

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManReadInstance(Psr_Man_t *p,int Func)

{
  int iVar1;
  int iVar2;
  char *pName;
  int local_24;
  int iFuncNew;
  int Status;
  int InstId;
  int Func_local;
  Psr_Man_t *p_local;
  
  iVar1 = Psr_ManUtilSkipSpaces(p);
  if (iVar1 == 0) {
    iVar1 = Psr_ManReadName(p);
    if ((iVar1 == 0) || (iVar2 = Psr_ManUtilSkipSpaces(p), iVar2 == 0)) {
      iVar2 = Psr_ManIsChar(p,'(');
      if (iVar2 == 0) {
        p_local._4_4_ = Psr_ManErrorSet(p,"Expecting \"(\" in module instantiation.",0);
      }
      else {
        p->pCur = p->pCur + 1;
        iVar2 = Psr_ManUtilSkipSpaces(p);
        if (iVar2 == 0) {
          iVar2 = Psr_ManIsChar(p,'.');
          if (iVar2 == 0) {
            pName = Abc_NamStr(p->pStrs,Func);
            Status = Psr_ManIsVerilogModule(p,pName);
            if (Status == 0) {
              iVar1 = Psr_ManErrorSet(p,"Cannot find elementary gate.",0);
              return iVar1;
            }
            local_24 = Psr_ManReadSignalList(p,&p->vTemp,')',1);
          }
          else {
            local_24 = Psr_ManReadSignalList2(p,&p->vTemp);
            Status = Func;
          }
          if (local_24 == 0) {
            p_local._4_4_ = Psr_ManErrorSet(p,"Error number 28.",0);
          }
          else {
            iVar2 = Psr_ManIsChar(p,')');
            if (iVar2 == 0) {
              __assert_fail("Psr_ManIsChar(p, \')\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadVer.c"
                            ,0x286,"int Psr_ManReadInstance(Psr_Man_t *, int)");
            }
            p->pCur = p->pCur + 1;
            iVar2 = Psr_ManUtilSkipSpaces(p);
            if (iVar2 == 0) {
              iVar2 = Psr_ManIsChar(p,';');
              if (iVar2 == 0) {
                p_local._4_4_ = Psr_ManErrorSet(p,"Expecting semicolon in the instance.",0);
              }
              else {
                Psr_NtkAddBox(p->pNtk,Status,iVar1,&p->vTemp);
                p_local._4_4_ = 1;
              }
            }
            else {
              p_local._4_4_ = Psr_ManErrorSet(p,"Error number 29.",0);
            }
          }
        }
        else {
          p_local._4_4_ = Psr_ManErrorSet(p,"Error number 27.",0);
        }
      }
    }
    else {
      p_local._4_4_ = Psr_ManErrorSet(p,"Error number 26.",0);
    }
  }
  else {
    p_local._4_4_ = Psr_ManErrorSet(p,"Error number 25.",0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManReadInstance( Psr_Man_t * p, int Func )
{
    int InstId, Status;
/*
    static Counter = 0;
    if ( ++Counter == 7 )
    {
        int s=0;
    }
*/
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 25.", 0);
    if ( (InstId = Psr_ManReadName(p)) )
        if (Psr_ManUtilSkipSpaces(p))       return Psr_ManErrorSet(p, "Error number 26.", 0);
    if ( !Psr_ManIsChar(p, '(') )           return Psr_ManErrorSet(p, "Expecting \"(\" in module instantiation.", 0);
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 27.", 0);
    if ( Psr_ManIsChar(p, '.') ) // box
        Status = Psr_ManReadSignalList2(p, &p->vTemp);
    else  // node
    {
        //char * s = Abc_NamStr(p->pStrs, Func);
        // translate elementary gate
        int iFuncNew = Psr_ManIsVerilogModule(p, Abc_NamStr(p->pStrs, Func));
        if ( iFuncNew == 0 )                return Psr_ManErrorSet(p, "Cannot find elementary gate.", 0);
        Func = iFuncNew;
        Status = Psr_ManReadSignalList( p, &p->vTemp, ')', 1 );
    }
    if ( Status == 0 )                      return Psr_ManErrorSet(p, "Error number 28.", 0);
    assert( Psr_ManIsChar(p, ')') );
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 29.", 0);
    if ( !Psr_ManIsChar(p, ';') )           return Psr_ManErrorSet(p, "Expecting semicolon in the instance.", 0);
    // add box 
    Psr_NtkAddBox( p->pNtk, Func, InstId, &p->vTemp );
    return 1;
}